

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

int yy_action(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar4 = yymatchChar(G,0x7b);
  if (iVar4 != 0) {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yy_braces(G);
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    iVar4 = yymatchChar(G,0x7d);
    if (iVar4 != 0) {
      yy__(G);
      return 1;
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_action(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "action"));
  if (!yymatchChar(G, '{')) goto l77;
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l77;
  l78:;	
  {  int yypos79= G->pos, yythunkpos79= G->thunkpos;  if (!yy_braces(G))  goto l79;
  goto l78;
  l79:;	  G->pos= yypos79; G->thunkpos= yythunkpos79;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l77;  if (!yymatchChar(G, '}')) goto l77;
  if (!yy__(G))  goto l77;
  yyprintf((stderr, "  ok   action"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l77:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "action"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}